

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

int tjDecompress2(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,uchar *dstBuf,int width,
                 int pitch,int height,int pixelFormat,int flags)

{
  j_decompress_ptr cinfo;
  int iVar1;
  code **ppcVar2;
  long lVar3;
  void *__ptr;
  uint uVar4;
  uint uVar5;
  tjinstance *this;
  char *__string;
  long lVar6;
  long lVar7;
  long lVar8;
  long *in_FS_OFFSET;
  my_progress_mgr progress;
  code *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  tjhandle local_38;
  
  if (handle == (tjhandle)0x0) {
    *(undefined8 *)((long)in_FS_OFFSET + -0xc9) = 0x656c646e616820;
    in_FS_OFFSET[-0x1a] = 0x2064696c61766e49;
    return -1;
  }
  cinfo = (j_decompress_ptr)((long)handle + 0x208);
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
  if ((*(byte *)((long)handle + 0x600) & 2) == 0) {
    memcpy((void *)((long)handle + 0x608),
           "tjDecompress2(): Instance has not been initialized for decompression",0x45);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    memcpy((void *)(*in_FS_OFFSET + -0xd0),
           "tjDecompress2(): Instance has not been initialized for decompression",0x45);
  }
  else {
    if ((((pixelFormat < 0xc) && (jpegBuf != (uchar *)0x0)) && (jpegSize != 0)) &&
       ((dstBuf != (uchar *)0x0 && (-1 < (pitch | width | height | pixelFormat))))) {
      if ((flags & 8U) == 0) {
        if ((flags & 0x10U) != 0) {
          __string = "JSIMD_FORCESSE=1";
          goto LAB_0010f15b;
        }
        if ((flags & 0x20U) != 0) {
          __string = "JSIMD_FORCESSE2=1";
          goto LAB_0010f15b;
        }
      }
      else {
        __string = "JSIMD_FORCEMMX=1";
LAB_0010f15b:
        putenv(__string);
      }
      if ((short)flags < 0) {
        ppcVar2 = &local_58;
        uStack_50 = 0;
        local_48 = 0;
        uStack_40 = 0;
        local_58 = my_progress_monitor;
        local_38 = handle;
      }
      else {
        ppcVar2 = (code **)0x0;
      }
      *(code ***)((long)handle + 0x218) = ppcVar2;
      iVar1 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
      if (iVar1 != 0) {
        __ptr = (void *)0x0;
        uVar5 = 0xffffffff;
        goto LAB_0010f108;
      }
      jpeg_mem_src_tj(cinfo,jpegBuf,jpegSize);
      jpeg_read_header(cinfo,1);
      *(J_COLOR_SPACE *)((long)handle + 0x248) = pf2cs[pixelFormat];
      if (((uint)flags >> 0xb & 1) != 0) {
        *(undefined4 *)((long)handle + 0x268) = 1;
      }
      if (((uint)flags >> 8 & 1) != 0) {
        *(undefined4 *)((long)handle + 0x26c) = 0;
      }
      if (width == 0) {
        width = *(int *)((long)handle + 0x238);
      }
      if (height == 0) {
        height = *(int *)((long)handle + 0x23c);
      }
      lVar3 = 0;
      do {
        iVar1 = sf[lVar3].denom;
        if (((sf[lVar3].num * *(int *)((long)handle + 0x238) + iVar1 + -1) / iVar1 <= width) &&
           ((iVar1 + sf[lVar3].num * *(int *)((long)handle + 0x23c) + -1) / iVar1 <= height)) {
          uVar5 = (uint)lVar3;
          goto LAB_0010f2a2;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      uVar5 = 0x10;
LAB_0010f2a2:
      if (uVar5 < 0x10) {
        *(tjscalingfactor *)((long)handle + 0x24c) = sf[uVar5];
        jpeg_start_decompress(cinfo);
        if (pitch == 0) {
          pitch = tjPixelSize[pixelFormat] * *(int *)((long)handle + 0x290);
        }
        __ptr = malloc((ulong)*(uint *)((long)handle + 0x294) << 3);
        if (__ptr == (void *)0x0) {
          builtin_strncpy((char *)((long)handle + 0x623),"ocation ",8);
          builtin_strncpy((char *)((long)handle + 0x62b),"failure",8);
          builtin_strncpy((char *)((long)handle + 0x618)," Memory ",8);
          builtin_strncpy((char *)((long)handle + 0x620),"allocati",8);
          builtin_strncpy((char *)((long)handle + 0x608),"tjDecomp",8);
          builtin_strncpy((char *)((long)handle + 0x610),"ress2():",8);
          *(undefined4 *)((long)handle + 0x6d0) = 1;
          builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb5),"ocation ",8);
          builtin_strncpy((char *)((long)in_FS_OFFSET + -0xad),"failure",8);
          in_FS_OFFSET[-0x18] = 0x2079726f6d654d20;
          in_FS_OFFSET[-0x17] = 0x697461636f6c6c61;
          in_FS_OFFSET[-0x1a] = 0x706d6f6365446a74;
          in_FS_OFFSET[-0x19] = 0x3a29283273736572;
          goto LAB_0010f3a1;
        }
        iVar1 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
        if (iVar1 == 0) {
          uVar5 = *(uint *)((long)handle + 0x294);
          lVar3 = (long)(int)uVar5;
          if (0 < lVar3) {
            lVar6 = 0;
            lVar8 = lVar6;
            do {
              uVar5 = uVar5 - 1;
              lVar7 = lVar6;
              if ((flags & 2U) != 0) {
                lVar7 = (ulong)uVar5 * (long)pitch;
              }
              *(uchar **)((long)__ptr + lVar8 * 8) = dstBuf + lVar7;
              lVar8 = lVar8 + 1;
              lVar6 = lVar6 + pitch;
            } while (lVar3 != lVar8);
          }
          uVar5 = *(uint *)((long)handle + 0x294);
          uVar4 = *(uint *)((long)handle + 0x2b0);
          if (uVar4 < uVar5) {
            do {
              jpeg_read_scanlines(cinfo,(JSAMPARRAY)((long)__ptr + (ulong)uVar4 * 8),uVar5 - uVar4);
              uVar5 = *(uint *)((long)handle + 0x294);
              uVar4 = *(uint *)((long)handle + 0x2b0);
            } while (uVar4 < uVar5);
          }
          jpeg_finish_decompress(cinfo);
          uVar5 = 0;
          goto LAB_0010f108;
        }
      }
      else {
        memcpy((void *)((long)handle + 0x608),
               "tjDecompress2(): Could not scale down to desired image dimensions",0x42);
        *(undefined4 *)((long)handle + 0x6d0) = 1;
        memcpy((void *)(*in_FS_OFFSET + -0xd0),
               "tjDecompress2(): Could not scale down to desired image dimensions",0x42);
LAB_0010f3a1:
        __ptr = (void *)0x0;
      }
      uVar5 = 0xffffffff;
      goto LAB_0010f108;
    }
    builtin_strncpy((char *)((long)handle + 0x618)," Invalid",8);
    builtin_strncpy((char *)((long)handle + 0x620)," argumen",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjDecomp",8);
    builtin_strncpy((char *)((long)handle + 0x610),"ress2():",8);
    *(undefined2 *)((long)handle + 0x628) = 0x74;
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    *(undefined2 *)(in_FS_OFFSET + -0x16) = 0x74;
    in_FS_OFFSET[-0x18] = 0x64696c61766e4920;
    in_FS_OFFSET[-0x17] = 0x6e656d7567726120;
    in_FS_OFFSET[-0x1a] = 0x706d6f6365446a74;
    in_FS_OFFSET[-0x19] = 0x3a29283273736572;
  }
  uVar5 = 0xffffffff;
  __ptr = (void *)0x0;
LAB_0010f108:
  if (200 < *(int *)((long)handle + 0x22c)) {
    jpeg_abort_decompress(cinfo);
  }
  free(__ptr);
  *(undefined4 *)((long)handle + 0x5fc) = 0;
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar5;
}

Assistant:

DLLEXPORT int tjDecompress2(tjhandle handle, const unsigned char *jpegBuf,
                            unsigned long jpegSize, unsigned char *dstBuf,
                            int width, int pitch, int height, int pixelFormat,
                            int flags)
{
  JSAMPROW *row_pointer = NULL;
  int i, retval = 0, jpegwidth, jpegheight, scaledw, scaledh;
  struct my_progress_mgr progress;

  GET_DINSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;
  if ((this->init & DECOMPRESS) == 0)
    THROW("tjDecompress2(): Instance has not been initialized for decompression");

  if (jpegBuf == NULL || jpegSize <= 0 || dstBuf == NULL || width < 0 ||
      pitch < 0 || height < 0 || pixelFormat < 0 || pixelFormat >= TJ_NUMPF)
    THROW("tjDecompress2(): Invalid argument");

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  if (flags & TJFLAG_LIMITSCANS) {
    MEMZERO(&progress, sizeof(struct my_progress_mgr));
    progress.pub.progress_monitor = my_progress_monitor;
    progress.this = this;
    dinfo->progress = &progress.pub;
  } else
    dinfo->progress = NULL;

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  jpeg_mem_src_tj(dinfo, jpegBuf, jpegSize);
  jpeg_read_header(dinfo, TRUE);
  this->dinfo.out_color_space = pf2cs[pixelFormat];
  if (flags & TJFLAG_FASTDCT) this->dinfo.dct_method = JDCT_FASTEST;
  if (flags & TJFLAG_FASTUPSAMPLE) dinfo->do_fancy_upsampling = FALSE;

  jpegwidth = dinfo->image_width;  jpegheight = dinfo->image_height;
  if (width == 0) width = jpegwidth;
  if (height == 0) height = jpegheight;
  for (i = 0; i < NUMSF; i++) {
    scaledw = TJSCALED(jpegwidth, sf[i]);
    scaledh = TJSCALED(jpegheight, sf[i]);
    if (scaledw <= width && scaledh <= height)
      break;
  }
  if (i >= NUMSF)
    THROW("tjDecompress2(): Could not scale down to desired image dimensions");
  width = scaledw;  height = scaledh;
  dinfo->scale_num = sf[i].num;
  dinfo->scale_denom = sf[i].denom;

  jpeg_start_decompress(dinfo);
  if (pitch == 0) pitch = dinfo->output_width * tjPixelSize[pixelFormat];

  if ((row_pointer =
       (JSAMPROW *)malloc(sizeof(JSAMPROW) * dinfo->output_height)) == NULL)
    THROW("tjDecompress2(): Memory allocation failure");
  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }
  for (i = 0; i < (int)dinfo->output_height; i++) {
    if (flags & TJFLAG_BOTTOMUP)
      row_pointer[i] = &dstBuf[(dinfo->output_height - i - 1) * (size_t)pitch];
    else
      row_pointer[i] = &dstBuf[i * (size_t)pitch];
  }
  while (dinfo->output_scanline < dinfo->output_height)
    jpeg_read_scanlines(dinfo, &row_pointer[dinfo->output_scanline],
                        dinfo->output_height - dinfo->output_scanline);
  jpeg_finish_decompress(dinfo);

bailout:
  if (dinfo->global_state > DSTATE_START) jpeg_abort_decompress(dinfo);
  free(row_pointer);
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}